

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O2

void vkt::ssbo::anon_unknown_15::generateCompareSrc
               (ostream *src,char *resultVar,BufferLayout *bufferLayout,BufferBlock *block,
               int instanceNdx,BlockDataPtr *blockPtr,BufferVar *bufVar,SubTypeAccess *accessPath,
               MatrixLoadFlags matrixLoadFlag)

{
  bool bVar1;
  pointer pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  BufferVarLayoutEntry *varLayout;
  char *pcVar7;
  void *valuePtr;
  ostream *poVar8;
  int precision;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  int rowNdex;
  int iVar10;
  undefined4 in_register_00000084;
  TypeComponentVector *accessPath_00;
  BlockDataPtr *accessPath_01;
  int iVar11;
  BufferVar *var;
  int iVar12;
  int rowNdex_1;
  int iVar13;
  int iVar14;
  int iVar15;
  MatrixLoadFlags in_stack_fffffffffffffee8;
  int local_110;
  int local_10c;
  VarType curType;
  string shaderName;
  undefined1 local_a0 [80];
  string apiName;
  
  accessPath_00 = (TypeComponentVector *)CONCAT44(in_register_00000084,instanceNdx);
  accessPath_01 = blockPtr;
  glu::SubTypeAccess::getType(&curType,(SubTypeAccess *)bufVar);
  if (curType.m_type == TYPE_STRUCT) {
    iVar15 = 0;
    iVar3 = (int)((*(long *)(CONCAT44(curType.m_data.basic.precision,curType.m_data.basic.type) +
                            0x28) -
                  *(long *)(CONCAT44(curType.m_data.basic.precision,curType.m_data.basic.type) +
                           0x20)) / 0x38);
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (; iVar3 != iVar15; iVar15 = iVar15 + 1) {
      glu::SubTypeAccess::member((SubTypeAccess *)local_a0,(SubTypeAccess *)bufVar,iVar15);
      generateCompareSrc(src,resultVar,bufferLayout,(BufferBlock *)((ulong)block & 0xffffffff),
                         instanceNdx,blockPtr,(BufferVar *)local_a0,(SubTypeAccess *)0x0,
                         in_stack_fffffffffffffee8);
      glu::SubTypeAccess::~SubTypeAccess((SubTypeAccess *)local_a0);
    }
    goto LAB_0066999b;
  }
  if (curType.m_type == TYPE_ARRAY) {
    if (curType.m_data.array.size == -1) {
      curType.m_data.array.size =
           *(int *)((long)&((bufferLayout[2].blocks.
                             super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus +
                   (long)(int)block * 4);
    }
    iVar15 = 0;
    iVar3 = curType.m_data.array.size;
    if (curType.m_data.array.size < 1) {
      iVar3 = 0;
    }
    for (; iVar3 != iVar15; iVar15 = iVar15 + 1) {
      glu::SubTypeAccess::element((SubTypeAccess *)local_a0,(SubTypeAccess *)bufVar,iVar15);
      generateCompareSrc(src,resultVar,bufferLayout,(BufferBlock *)((ulong)block & 0xffffffff),
                         instanceNdx,blockPtr,(BufferVar *)local_a0,(SubTypeAccess *)0x0,
                         in_stack_fffffffffffffee8);
      glu::SubTypeAccess::~SubTypeAccess((SubTypeAccess *)local_a0);
    }
    goto LAB_0066999b;
  }
  var = (BufferVar *)(&(bufVar->m_name).field_2._M_allocated_capacity + 1);
  ssbo::(anonymous_namespace)::getAPIName_abi_cxx11_
            (&apiName,(_anonymous_namespace_ *)bufferLayout,(BufferBlock *)blockPtr,var,
             accessPath_00);
  iVar3 = BufferLayout::getVariableIndex((BufferLayout *)resultVar,&apiName);
  varLayout = (BufferVarLayoutEntry *)((long)iVar3 * 0x48 + *(long *)(resultVar + 0x18));
  ssbo::(anonymous_namespace)::getShaderName_abi_cxx11_
            (&shaderName,(_anonymous_namespace_ *)bufferLayout,
             (BufferBlock *)((ulong)block & 0xffffffff),(int)blockPtr,var,
             (TypeComponentVector *)accessPath_01);
  pcVar7 = glu::getDataTypeName(curType.m_data.basic.type);
  pVVar2 = (((TypeComponentVector *)CONCAT44(in_register_00000084,instanceNdx))->
           super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>).
           _M_impl.super__Vector_impl_data._M_start;
  iVar3 = computeOffset(varLayout,(TypeComponentVector *)var);
  valuePtr = (void *)((long)&pVVar2->type + (long)iVar3);
  if (curType.m_data.basic.type - TYPE_FLOAT_MAT2 < 9 ||
      curType.m_data.basic.type - TYPE_DOUBLE_MAT2 < 9) {
    if ((int)accessPath != 1) {
      poVar8 = std::operator<<(src,"\t");
      poVar8 = std::operator<<(poVar8,"allOk");
      poVar8 = std::operator<<(poVar8," = ");
      poVar8 = std::operator<<(poVar8,"allOk");
      poVar8 = std::operator<<(poVar8," && compare_");
      poVar8 = std::operator<<(poVar8,pcVar7);
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = std::operator<<(poVar8,(string *)&shaderName);
      std::operator<<(poVar8,", ");
      generateImmMatrixSrc
                (src,curType.m_data.basic.type,varLayout->matrixStride,varLayout->isRowMajor,
                 valuePtr);
      goto LAB_006697bc;
    }
    iVar3 = varLayout->matrixStride;
    bVar1 = varLayout->isRowMajor;
    std::__cxx11::string::string((string *)(local_a0 + 0x30),(string *)&shaderName);
    iVar4 = glu::getDataTypeMatrixNumRows(curType.m_data.basic.type);
    iVar5 = glu::getDataTypeMatrixNumColumns(curType.m_data.basic.type);
    iVar15 = 0;
    if (0 < iVar4) {
      iVar15 = iVar4;
    }
    local_110 = 0;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    local_10c = 0;
    for (iVar12 = 0; iVar12 != iVar5; iVar12 = iVar12 + 1) {
      iVar13 = local_110;
      iVar11 = local_10c;
      for (iVar10 = 0; iVar15 != iVar10; iVar10 = iVar10 + 1) {
        poVar8 = std::operator<<(src,"\t");
        poVar8 = std::operator<<(poVar8,"allOk");
        poVar8 = std::operator<<(poVar8," = ");
        poVar8 = std::operator<<(poVar8,"allOk");
        poVar8 = std::operator<<(poVar8," && compare_");
        poVar8 = std::operator<<(poVar8,"float");
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = std::operator<<(poVar8,(string *)(local_a0 + 0x30));
        poVar8 = std::operator<<(poVar8,"[");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
        poVar8 = std::operator<<(poVar8,"][");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar10);
        std::operator<<(poVar8,"], ");
        iVar14 = iVar11;
        if (bVar1 != false) {
          iVar14 = iVar13;
        }
        de::floatToString_abi_cxx11_
                  ((string *)local_a0,(de *)0x1,*(float *)((long)valuePtr + (long)iVar14),precision)
        ;
        std::operator<<(src,(string *)local_a0);
        std::__cxx11::string::~string((string *)local_a0);
        std::operator<<(src,");\n");
        iVar11 = iVar11 + 4;
        iVar13 = iVar13 + iVar3;
      }
      local_10c = local_10c + iVar3;
      local_110 = local_110 + 4;
    }
    iVar13 = 0;
    local_110 = 0;
    for (iVar12 = 0; iVar12 != iVar5; iVar12 = iVar12 + 1) {
      poVar8 = std::operator<<(src,"\t");
      poVar8 = std::operator<<(poVar8,"allOk");
      poVar8 = std::operator<<(poVar8," = ");
      poVar8 = std::operator<<(poVar8,"allOk");
      poVar8 = std::operator<<(poVar8," && compare_");
      poVar8 = std::operator<<(poVar8,"vec");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar4);
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = std::operator<<(poVar8,(string *)(local_a0 + 0x30));
      poVar8 = std::operator<<(poVar8,"[");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
      poVar8 = std::operator<<(poVar8,"], ");
      poVar8 = std::operator<<(poVar8,"vec");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar4);
      std::operator<<(poVar8,"(");
      uVar9 = extraout_RDX;
      iVar10 = local_110;
      iVar11 = iVar13;
      for (iVar14 = 0; iVar15 != iVar14; iVar14 = iVar14 + 1) {
        iVar6 = iVar10;
        if (bVar1 != false) {
          iVar6 = iVar11;
        }
        de::floatToString_abi_cxx11_
                  ((string *)local_a0,(de *)0x1,*(float *)((long)valuePtr + (long)iVar6),(int)uVar9)
        ;
        std::operator<<(src,(string *)local_a0);
        std::__cxx11::string::~string((string *)local_a0);
        uVar9 = extraout_RDX_00;
        if (iVar14 < iVar4 + -1) {
          std::operator<<(src,", ");
          uVar9 = extraout_RDX_01;
        }
        iVar10 = iVar10 + 4;
        iVar11 = iVar11 + iVar3;
      }
      std::operator<<(src,"));\n");
      local_110 = local_110 + iVar3;
      iVar13 = iVar13 + 4;
    }
    std::__cxx11::string::~string((string *)(local_a0 + 0x30));
  }
  else {
    poVar8 = std::operator<<(src,"\t");
    poVar8 = std::operator<<(poVar8,"allOk");
    poVar8 = std::operator<<(poVar8," = ");
    poVar8 = std::operator<<(poVar8,"allOk");
    poVar8 = std::operator<<(poVar8," && compare_");
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = std::operator<<(poVar8,(string *)&shaderName);
    std::operator<<(poVar8,", ");
    generateImmScalarVectorSrc(src,curType.m_data.basic.type,valuePtr);
LAB_006697bc:
    std::operator<<(src,");\n");
  }
  std::__cxx11::string::~string((string *)&shaderName);
  std::__cxx11::string::~string((string *)&apiName);
LAB_0066999b:
  glu::VarType::~VarType(&curType);
  return;
}

Assistant:

void generateCompareSrc (
	std::ostream&				src,
	const char*					resultVar,
	const BufferLayout&			bufferLayout,
	const BufferBlock&			block,
	int							instanceNdx,
	const BlockDataPtr&			blockPtr,
	const BufferVar&			bufVar,
	const glu::SubTypeAccess&	accessPath,
	MatrixLoadFlags				matrixLoadFlag)
{
	const VarType curType = accessPath.getType();

	if (curType.isArrayType())
	{
		const int arraySize = curType.getArraySize() == VarType::UNSIZED_ARRAY ? block.getLastUnsizedArraySize(instanceNdx) : curType.getArraySize();

		for (int elemNdx = 0; elemNdx < arraySize; elemNdx++)
			generateCompareSrc(src, resultVar, bufferLayout, block, instanceNdx, blockPtr, bufVar, accessPath.element(elemNdx), LOAD_FULL_MATRIX);
	}
	else if (curType.isStructType())
	{
		const int numMembers = curType.getStructPtr()->getNumMembers();

		for (int memberNdx = 0; memberNdx < numMembers; memberNdx++)
			generateCompareSrc(src, resultVar, bufferLayout, block, instanceNdx, blockPtr, bufVar, accessPath.member(memberNdx), LOAD_FULL_MATRIX);
	}
	else
	{
		DE_ASSERT(curType.isBasicType());

		const string	apiName	= getAPIName(block, bufVar, accessPath.getPath());
		const int		varNdx	= bufferLayout.getVariableIndex(apiName);

		DE_ASSERT(varNdx >= 0);
		{
			const BufferVarLayoutEntry&	varLayout		= bufferLayout.bufferVars[varNdx];
			const string				shaderName		= getShaderName(block, instanceNdx, bufVar, accessPath.getPath());
			const glu::DataType			basicType		= curType.getBasicType();
			const bool					isMatrix		= glu::isDataTypeMatrix(basicType);
			const char*					typeName		= glu::getDataTypeName(basicType);
			const void*					valuePtr		= (const deUint8*)blockPtr.ptr + computeOffset(varLayout, accessPath.getPath());


			if (isMatrix)
			{
				if (matrixLoadFlag == LOAD_MATRIX_COMPONENTS)
					generateImmMatrixSrc(src, basicType, varLayout.matrixStride, varLayout.isRowMajor, valuePtr, resultVar, typeName, shaderName);
				else
				{
					src << "\t" << resultVar << " = " << resultVar << " && compare_" << typeName << "(" << shaderName << ", ";
					generateImmMatrixSrc (src, basicType, varLayout.matrixStride, varLayout.isRowMajor, valuePtr);
					src << ");\n";
				}
			}
			else
			{
				src << "\t" << resultVar << " = " << resultVar << " && compare_" << typeName << "(" << shaderName << ", ";
				generateImmScalarVectorSrc(src, basicType, valuePtr);
				src << ");\n";
			}
		}
	}
}